

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Num.cpp
# Opt level: O0

void __thiscall Num::Num(Num *this,string *str,Short k)

{
  Short k_local;
  string *str_local;
  Num *this_local;
  
  std::__cxx11::string::string((string *)&this->base);
  this->size = k;
  std::__cxx11::string::operator=((string *)&this->base,(string *)str);
  return;
}

Assistant:

Num::Num(std::string& str, Short k)  // constructor that create number using a string
{
    size = k;
    base = str;
}